

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void free_ParseTreeBelow(Parser *p,PNode *pn)

{
  PNode *pPVar1;
  uint32 uVar2;
  PNode *amb;
  uint i;
  PNode *pn_local;
  Parser *p_local;
  
  for (amb._4_4_ = 0; amb._4_4_ < (pn->children).n; amb._4_4_ = amb._4_4_ + 1) {
    pPVar1 = (pn->children).v[amb._4_4_];
    uVar2 = pPVar1->refcount - 1;
    pPVar1->refcount = uVar2;
    if (uVar2 == 0) {
      free_PNode(p,(pn->children).v[amb._4_4_]);
    }
  }
  if (((pn->children).v != (PNode **)0x0) && ((pn->children).v != (pn->children).e)) {
    free((pn->children).v);
  }
  (pn->children).n = 0;
  (pn->children).v = (PNode **)0x0;
  pPVar1 = pn->ambiguities;
  if (pPVar1 != (PNode *)0x0) {
    pn->ambiguities = (PNode *)0x0;
    free_PNode(p,pPVar1);
  }
  return;
}

Assistant:

static void free_ParseTreeBelow(Parser *p, PNode *pn) {
  uint i;
  PNode *amb;

  for (i = 0; i < pn->children.n; i++) unref_pn(p, pn->children.v[i]);
  vec_free(&pn->children);
  if ((amb = pn->ambiguities)) {
    pn->ambiguities = NULL;
    free_PNode(p, amb);
  }
}